

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS
ref_metric_cons_assembly
          (REF_DBL *metric,REF_DBL *g,REF_GRID ref_grid,REF_INT ldim,REF_DBL *prim_dual,
          REF_RECON_RECONSTRUCTION reconstruction)

{
  double dVar1;
  REF_NODE pRVar2;
  uint uVar3;
  REF_DBL *scalar;
  ulong uVar4;
  REF_DBL *hessian;
  long lVar5;
  REF_DBL *pRVar6;
  undefined8 uVar7;
  REF_DBL *pRVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  REF_STATUS RVar13;
  ulong uVar14;
  double dVar15;
  REF_DBL conserved [5];
  REF_DBL state [5];
  
  pRVar2 = ref_grid->node;
  uVar14 = (ulong)(uint)pRVar2->max;
  if (pRVar2->max < 0) {
    pcVar10 = "malloc cons of REF_DBL negative";
    uVar7 = 0xc31;
LAB_001ca2f9:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar7,
           "ref_metric_cons_assembly",pcVar10);
    RVar13 = 1;
  }
  else {
    scalar = (REF_DBL *)malloc(uVar14 * 8);
    if (scalar == (REF_DBL *)0x0) {
      pcVar10 = "malloc cons of REF_DBL NULL";
      uVar7 = 0xc31;
    }
    else {
      for (uVar4 = 0; uVar14 != uVar4; uVar4 = uVar4 + 1) {
        scalar[uVar4] = 0.0;
      }
      hessian = (REF_DBL *)malloc(uVar14 * 0x30);
      if (hessian != (REF_DBL *)0x0) {
        for (uVar4 = 0; (uVar14 * 6 & 0xffffffff) != uVar4; uVar4 = uVar4 + 1) {
          hessian[uVar4] = 0.0;
        }
        lVar11 = 0;
        do {
          if (lVar11 == 5) {
            free(hessian);
            free(scalar);
            return 0;
          }
          pRVar6 = prim_dual;
          for (lVar12 = 0; lVar12 < (int)uVar14; lVar12 = lVar12 + 1) {
            if (-1 < pRVar2->global[lVar12]) {
              for (lVar5 = 0; lVar5 != 5; lVar5 = lVar5 + 1) {
                state[lVar5] = pRVar6[lVar5];
              }
              uVar3 = ref_phys_make_conserved(state,conserved);
              if (uVar3 != 0) {
                pcVar10 = "prim2cons";
                uVar7 = 0xc39;
                goto LAB_001ca510;
              }
              scalar[lVar12] = conserved[lVar11];
              uVar14 = (ulong)(uint)pRVar2->max;
            }
            pRVar6 = pRVar6 + ldim;
          }
          uVar3 = ref_recon_hessian(ref_grid,scalar,hessian,reconstruction);
          if (uVar3 != 0) {
            pcVar10 = "hess";
            uVar7 = 0xc3c;
LAB_001ca510:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,uVar7,"ref_metric_cons_assembly",(ulong)uVar3,pcVar10);
            return uVar3;
          }
          uVar3 = pRVar2->max;
          uVar14 = (ulong)uVar3;
          uVar4 = 0;
          if (0 < (int)uVar3) {
            uVar4 = (ulong)uVar3;
          }
          pRVar6 = hessian;
          pRVar8 = metric;
          for (uVar9 = 0; uVar9 != uVar4; uVar9 = uVar9 + 1) {
            if (-1 < pRVar2->global[uVar9]) {
              lVar12 = 0;
              while (lVar12 != 6) {
                dVar15 = g[lVar11 + uVar9 * 5];
                if (dVar15 <= -dVar15) {
                  dVar15 = -dVar15;
                }
                dVar1 = pRVar6[lVar12];
                dVar15 = dVar15 * dVar1 + pRVar8[lVar12];
                pRVar8[lVar12] = dVar15;
                if (0x7fefffffffffffff < (ulong)ABS(g[lVar11 + uVar9 * 5])) {
                  pcVar10 = "g not finite";
                  uVar7 = 0xc41;
                  goto LAB_001ca2f9;
                }
                if (0x7fefffffffffffff < (ulong)ABS(dVar1)) {
                  pcVar10 = "hess not finite";
                  uVar7 = 0xc42;
                  goto LAB_001ca2f9;
                }
                lVar12 = lVar12 + 1;
                if (0x7fefffffffffffff < (long)ABS(dVar15)) {
                  pcVar10 = "metric not finite";
                  uVar7 = 0xc43;
                  goto LAB_001ca2f9;
                }
              }
            }
            pRVar8 = pRVar8 + 6;
            pRVar6 = pRVar6 + 6;
          }
          lVar11 = lVar11 + 1;
        } while( true );
      }
      pcVar10 = "malloc hess_cons of REF_DBL NULL";
      uVar7 = 0xc32;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar7,
           "ref_metric_cons_assembly",pcVar10);
    RVar13 = 2;
  }
  return RVar13;
}

Assistant:

REF_FCN REF_STATUS ref_metric_cons_assembly(
    REF_DBL *metric, REF_DBL *g, REF_GRID ref_grid, REF_INT ldim,
    REF_DBL *prim_dual, REF_RECON_RECONSTRUCTION reconstruction) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT var, node, i;
  REF_DBL state[5], conserved[5];
  REF_DBL *cons, *hess_cons;

  ref_malloc_init(cons, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(hess_cons, 6 * ref_node_max(ref_node), REF_DBL, 0.0);

  for (var = 0; var < 5; var++) {
    each_ref_node_valid_node(ref_node, node) {
      for (i = 0; i < 5; i++) {
        state[i] = prim_dual[i + ldim * node];
      }
      RSS(ref_phys_make_conserved(state, conserved), "prim2cons");
      cons[node] = conserved[var];
    }
    RSS(ref_recon_hessian(ref_grid, cons, hess_cons, reconstruction), "hess");
    each_ref_node_valid_node(ref_node, node) {
      for (i = 0; i < 6; i++) {
        metric[i + 6 * node] +=
            ABS(g[var + 5 * node]) * hess_cons[i + 6 * node];
        RAS(isfinite(ABS(g[var + 5 * node])), "g not finite");
        RAS(isfinite(hess_cons[i + 6 * node]), "hess not finite");
        RAS(isfinite(metric[i + 6 * node]), "metric not finite");
      }
    }
  }

  ref_free(hess_cons);
  ref_free(cons);

  return REF_SUCCESS;
}